

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O2

void __thiscall Face::print(Face *this)

{
  Color CVar1;
  int entry;
  int iVar2;
  int iVar3;
  int iVar4;
  int layer;
  int layer_00;
  int iVar5;
  bool bVar6;
  
  CVar1 = this->center_color;
  iVar4 = 3;
  iVar5 = 1;
  for (layer_00 = 0; iVar2 = iVar4, layer_00 != 4; layer_00 = layer_00 + 1) {
    while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
      putchar(0x20);
    }
    for (iVar2 = 0; iVar3 = iVar4, iVar5 != iVar2; iVar2 = iVar2 + 1) {
      print_triangle(this,(uint)(CVar1 == green) * 3,layer_00,iVar2);
    }
    while (iVar3 != 0) {
      putchar(0x20);
      iVar3 = iVar3 + -1;
    }
    putchar(10);
    iVar4 = iVar4 + -1;
    iVar5 = iVar5 + 2;
  }
  return;
}

Assistant:

void Face::print(){
    Corner ref_corner;
    if(center_color == Color::green){
        ref_corner = Corner::B;
    }
    else{
        ref_corner = Corner::U;
    }
    for(int layer = 0; layer < 4; layer++){
        int row_len = 2*layer + 1;
        for(int j = 0; j < (7-row_len)/2; j++){
            printf(" ");
        }
        for(int entry = 0; entry < row_len; entry++){
            print_triangle(ref_corner, layer, entry);
        }
        for(int j = 0; j < (7-row_len)/2; j++){
            printf(" ");
        }
        printf("\n");
    }
}